

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu_registers.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_318430::PpuVram_increase_coarse_x_switches_horizontal_nametable_Test::
~PpuVram_increase_coarse_x_switches_horizontal_nametable_Test
          (PpuVram_increase_coarse_x_switches_horizontal_nametable_Test *this)

{
  PpuVram_increase_coarse_x_switches_horizontal_nametable_Test *this_local;
  
  ~PpuVram_increase_coarse_x_switches_horizontal_nametable_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PpuVram, increase_coarse_x_switches_horizontal_nametable) {
    PpuVram v{0b000'00'00000'11111};
    v.increase_coarse_x();
    EXPECT_EQ(0b000'01'00000'00000, v.value());

    v = PpuVram(0b000'01'00000'11111);
    v.increase_coarse_x();
    EXPECT_EQ(0b000'00'00000'00000, v.value());
}